

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileiconprovider.cpp
# Opt level: O2

QIcon __thiscall QFileIconProvider::icon(QFileIconProvider *this,QFileInfo *info)

{
  long lVar1;
  long lVar2;
  QIcon QVar3;
  char cVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> QStack_68;
  QArrayDataPointer<char16_t> local_50;
  QIcon retIcon;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(info + 8);
  retIcon.d = (QIconPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QAbstractFileIconProviderPrivate::getPlatformThemeIcon((QFileInfo *)&retIcon);
  cVar4 = QIcon::isNull();
  QVar3 = retIcon;
  if (cVar4 == '\0') {
    retIcon.d = (QIconPrivate *)0x0;
    *(QIconPrivate **)this = QVar3.d;
    goto LAB_002b9d46;
  }
  QFileInfo::absoluteFilePath();
  if ((local_50.size == 0) ||
     (cVar4 = QFileSystemEntry::isRootPath((QString *)&local_50), cVar4 != '\0')) {
LAB_002b9d20:
    QFileIconProviderPrivate::getIcon((QFileIconProviderPrivate *)this,(StandardPixmap)lVar2);
  }
  else {
    cVar4 = QFileInfo::isFile();
    if (cVar4 != '\0') {
      QFileInfo::isSymLink();
      goto LAB_002b9d20;
    }
    cVar4 = QFileInfo::isDir();
    if (cVar4 != '\0') {
      cVar4 = QFileInfo::isSymLink();
      if (cVar4 == '\0') {
        QFileInfo::absoluteFilePath();
        ::comparesEqual((QString *)&QStack_68,(QString *)(lVar2 + 0x20));
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&QStack_68);
      }
      goto LAB_002b9d20;
    }
    QIcon::QIcon((QIcon *)this);
  }
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
LAB_002b9d46:
  QIcon::~QIcon(&retIcon);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return (QIcon)(QIconPrivate *)this;
}

Assistant:

QIcon QFileIconProvider::icon(const QFileInfo &info) const
{
    Q_D(const QFileIconProvider);

    QIcon retIcon = d->getIcon(info);
    if (!retIcon.isNull())
        return retIcon;

    const QString &path = info.absoluteFilePath();
    if (path.isEmpty() || QFileSystemEntry::isRootPath(path))
#if defined (Q_OS_WIN)
    {
        UINT type = GetDriveType(reinterpret_cast<const wchar_t *>(path.utf16()));

        switch (type) {
        case DRIVE_REMOVABLE:
            return d->getIcon(QStyle::SP_DriveFDIcon);
        case DRIVE_FIXED:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        case DRIVE_REMOTE:
            return d->getIcon(QStyle::SP_DriveNetIcon);
        case DRIVE_CDROM:
            return d->getIcon(QStyle::SP_DriveCDIcon);
        case DRIVE_RAMDISK:
        case DRIVE_UNKNOWN:
        case DRIVE_NO_ROOT_DIR:
        default:
            return d->getIcon(QStyle::SP_DriveHDIcon);
        }
    }
#else
    return d->getIcon(QStyle::SP_DriveHDIcon);
#endif

    if (info.isFile()) {
        if (info.isSymLink())
            return d->getIcon(QStyle::SP_FileLinkIcon);
        else
            return d->getIcon(QStyle::SP_FileIcon);
    }
  if (info.isDir()) {
    if (info.isSymLink()) {
      return d->getIcon(QStyle::SP_DirLinkIcon);
    } else {
      if (info.absoluteFilePath() == d->homePath) {
        return d->getIcon(QStyle::SP_DirHomeIcon);
      } else {
        return d->getIcon(QStyle::SP_DirIcon);
      }
    }
  }
  return QIcon();
}